

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

void __thiscall irr::gui::CGUISpriteBank::~CGUISpriteBank(CGUISpriteBank *this,void **vtt)

{
  undefined8 *in_RSI;
  IGUISpriteBank *in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  in_RDI->_vptr_IGUISpriteBank = (_func_int **)*in_RSI;
  *(undefined8 *)((long)&in_RDI->_vptr_IGUISpriteBank + (long)in_RDI->_vptr_IGUISpriteBank[-3]) =
       in_RSI[3];
  (*in_RDI->_vptr_IGUISpriteBank[7])();
  if (*(long *)&in_RDI[3].field_0x10 != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  core::array<irr::video::ITexture_*>::~array((array<irr::video::ITexture_*> *)0x3d3d5c);
  core::array<irr::core::rect<int>_>::~array((array<irr::core::rect<int>_> *)0x3d3d6a);
  core::array<irr::gui::SGUISprite>::~array((array<irr::gui::SGUISprite> *)0x3d3d78);
  IGUISpriteBank::~IGUISpriteBank(in_RDI,(void **)(in_RSI + 1));
  return;
}

Assistant:

CGUISpriteBank::~CGUISpriteBank()
{
	clear();

	// drop video driver
	if (Driver)
		Driver->drop();
}